

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

bool __thiscall QRhiWidgetPrivate::invokeInitialize(QRhiWidgetPrivate *this,QRhiCommandBuffer *cb)

{
  QRhiTexture *pQVar1;
  long *plVar2;
  bool bVar3;
  char cVar4;
  QRhiRenderBuffer *pQVar5;
  QRhiTextureRenderTarget *pQVar6;
  QRhiRenderPassDescriptor *pQVar7;
  QRhiTexture *pQVar8;
  long in_FS_OFFSET;
  QRhiTextureRenderTargetDescription rtDesc;
  char local_240 [24];
  char *local_228;
  long local_220;
  QRhiColorAttachment local_218;
  undefined4 local_1e0;
  undefined8 local_1dc;
  undefined8 uStack_1d4;
  undefined4 local_1cc;
  char *local_1c8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->colorTexture;
  if (pQVar1 == (QRhiTexture *)0x0 && (QRhiTexture *)this->msaaColorBuffer == (QRhiTexture *)0x0) {
LAB_002e7ded:
    bVar3 = false;
  }
  else {
    plVar2 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
    if (this->autoRenderTarget == true) {
      pQVar8 = (QRhiTexture *)this->msaaColorBuffer;
      if (pQVar1 != (QRhiTexture *)0x0) {
        pQVar8 = pQVar1;
      }
      local_220 = *(long *)(pQVar8 + 0x34);
      pQVar5 = this->depthStencilBuffer;
      if (pQVar5 == (QRhiRenderBuffer *)0x0) {
        pQVar5 = (QRhiRenderBuffer *)QRhi::newRenderBuffer(this->rhi,0,&local_220,this->samples,0,0)
        ;
        this->depthStencilBuffer = pQVar5;
        cVar4 = (**(code **)(*(long *)pQVar5 + 0x20))(pQVar5);
        if (cVar4 == '\0') {
          local_1e0 = 2;
          local_1cc = 0;
          local_1dc = 0;
          uStack_1d4 = 0;
          local_1c8 = "default";
          QMessageLogger::warning
                    ((char *)&local_1e0,"Failed to create depth-stencil buffer for QRhiWidget");
          resetRenderTargetObjects(this);
          goto LAB_002e7ded;
        }
      }
      else if (local_220 != *(long *)(pQVar5 + 0x34)) {
        *(long *)(pQVar5 + 0x34) = local_220;
        cVar4 = (**(code **)(*(long *)this->depthStencilBuffer + 0x20))();
        if (cVar4 == '\0') {
          local_1e0 = 2;
          local_1cc = 0;
          local_1dc = 0;
          uStack_1d4 = 0;
          local_1c8 = "default";
          QMessageLogger::warning
                    ((char *)&local_1e0,
                     "Failed to rebuild depth-stencil buffer for QRhiWidget with new size");
          goto LAB_002e7ded;
        }
      }
      if (this->renderTarget == (QRhiTextureRenderTarget *)0x0) {
        local_218._44_4_ = 0xaaaaaaaa;
        local_218.m_texture = (QRhiTexture *)0x0;
        local_218.m_renderBuffer = (QRhiRenderBuffer *)0x0;
        local_218.m_layer = 0;
        local_218.m_level = 0;
        local_218.m_resolveTexture._0_4_ = 0;
        local_218.m_resolveTexture._4_4_ = 0;
        local_218.m_resolveLayer = 0;
        local_218.m_resolveLevel = 0;
        local_218.m_multiViewCount = 0;
        pQVar1 = this->colorTexture;
        if (this->colorTexture == (QRhiTexture *)0x0) {
          local_218.m_renderBuffer = this->msaaColorBuffer;
          pQVar1 = local_218.m_texture;
        }
        local_218.m_texture = pQVar1;
        if (1 < this->samples) {
          local_218.m_resolveTexture._0_4_ = SUB84(this->resolveTexture,0);
          local_218.m_resolveTexture._4_4_ = (undefined4)((ulong)this->resolveTexture >> 0x20);
        }
        memset((QRhiTextureRenderTargetDescription *)&local_1e0,0xaa,0x1b8);
        QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription
                  ((QRhiTextureRenderTargetDescription *)&local_1e0,&local_218,
                   this->depthStencilBuffer);
        pQVar6 = (QRhiTextureRenderTarget *)
                 QRhi::newTextureRenderTarget
                           (this->rhi,(QRhiTextureRenderTargetDescription *)&local_1e0,0);
        this->renderTarget = pQVar6;
        pQVar7 = (QRhiRenderPassDescriptor *)(**(code **)(*(long *)pQVar6 + 0x38))(pQVar6);
        this->renderPassDescriptor = pQVar7;
        pQVar6 = this->renderTarget;
        *(QRhiRenderPassDescriptor **)(pQVar6 + 0x30) = pQVar7;
        cVar4 = (**(code **)(*(long *)pQVar6 + 0x40))();
        if (cVar4 == '\0') {
          local_240[0] = '\x02';
          local_240[1] = '\0';
          local_240[2] = '\0';
          local_240[3] = '\0';
          local_240[0x14] = '\0';
          local_240[0x15] = '\0';
          local_240[0x16] = '\0';
          local_240[0x17] = '\0';
          local_240[4] = '\0';
          local_240[5] = '\0';
          local_240[6] = '\0';
          local_240[7] = '\0';
          local_240[8] = '\0';
          local_240[9] = '\0';
          local_240[10] = '\0';
          local_240[0xb] = '\0';
          local_240[0xc] = '\0';
          local_240[0xd] = '\0';
          local_240[0xe] = '\0';
          local_240[0xf] = '\0';
          local_240[0x10] = '\0';
          local_240[0x11] = '\0';
          local_240[0x12] = '\0';
          local_240[0x13] = '\0';
          local_228 = "default";
          QMessageLogger::warning(local_240,"Failed to create render target for QRhiWidget");
          resetRenderTargetObjects(this);
          QVarLengthArray<QRhiColorAttachment,_8LL>::~QVarLengthArray
                    ((QVarLengthArray<QRhiColorAttachment,_8LL> *)&local_1e0);
          goto LAB_002e7ded;
        }
        QVarLengthArray<QRhiColorAttachment,_8LL>::~QVarLengthArray
                  ((QVarLengthArray<QRhiColorAttachment,_8LL> *)&local_1e0);
      }
    }
    else {
      resetRenderTargetObjects(this);
    }
    (**(code **)(*plVar2 + 0x1a0))(plVar2,cb);
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QRhiWidgetPrivate::invokeInitialize(QRhiCommandBuffer *cb)
{
    Q_Q(QRhiWidget);
    if (!colorTexture && !msaaColorBuffer)
        return false;

    if (autoRenderTarget) {
        const QSize pixelSize = colorTexture ? colorTexture->pixelSize() : msaaColorBuffer->pixelSize();
        if (!depthStencilBuffer) {
            depthStencilBuffer = rhi->newRenderBuffer(QRhiRenderBuffer::DepthStencil, pixelSize, samples);
            if (!depthStencilBuffer->create()) {
                qWarning("Failed to create depth-stencil buffer for QRhiWidget");
                resetRenderTargetObjects();
                return false;
            }
        } else if (depthStencilBuffer->pixelSize() != pixelSize) {
            depthStencilBuffer->setPixelSize(pixelSize);
            if (!depthStencilBuffer->create()) {
                qWarning("Failed to rebuild depth-stencil buffer for QRhiWidget with new size");
                return false;
            }
        }

        if (!renderTarget) {
            QRhiColorAttachment color0;
            if (colorTexture)
                color0.setTexture(colorTexture);
            else
                color0.setRenderBuffer(msaaColorBuffer);
            if (samples > 1)
                color0.setResolveTexture(resolveTexture);
            QRhiTextureRenderTargetDescription rtDesc(color0, depthStencilBuffer);
            renderTarget = rhi->newTextureRenderTarget(rtDesc);
            renderPassDescriptor = renderTarget->newCompatibleRenderPassDescriptor();
            renderTarget->setRenderPassDescriptor(renderPassDescriptor);
            if (!renderTarget->create()) {
                qWarning("Failed to create render target for QRhiWidget");
                resetRenderTargetObjects();
                return false;
            }
        }
    } else {
        resetRenderTargetObjects();
    }

    q->initialize(cb);

    return true;
}